

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_26::binarySearchForRootPrimaryNode
                  (int32_t *rootPrimaryIndexes,int32_t length,int64_t *nodes,uint32_t p)

{
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  uint32_t nodePrimary;
  int64_t node;
  int32_t i;
  int32_t limit;
  int32_t start;
  uint32_t p_local;
  int64_t *nodes_local;
  int32_t length_local;
  int32_t *rootPrimaryIndexes_local;
  
  if (length == 0) {
    rootPrimaryIndexes_local._4_4_ = 0xffffffff;
  }
  else {
    i = 0;
    node._4_4_ = length;
    iVar1 = i;
    do {
      while( true ) {
        i = iVar1;
        iVar2 = (i + node._4_4_) / 2;
        uVar3 = (uint)((ulong)nodes[rootPrimaryIndexes[iVar2]] >> 0x20);
        if (p == uVar3) {
          return iVar2;
        }
        if (uVar3 <= p) break;
        node._4_4_ = iVar2;
        iVar1 = i;
        if (iVar2 == i) {
          return i ^ 0xffffffff;
        }
      }
      iVar1 = iVar2;
    } while (iVar2 != i);
    rootPrimaryIndexes_local._4_4_ = i + 1U ^ 0xffffffff;
  }
  return rootPrimaryIndexes_local._4_4_;
}

Assistant:

int32_t
binarySearchForRootPrimaryNode(const int32_t *rootPrimaryIndexes, int32_t length,
                               const int64_t *nodes, uint32_t p) {
    if(length == 0) { return ~0; }
    int32_t start = 0;
    int32_t limit = length;
    for (;;) {
        int32_t i = (start + limit) / 2;
        int64_t node = nodes[rootPrimaryIndexes[i]];
        uint32_t nodePrimary = (uint32_t)(node >> 32);  // weight32FromNode(node)
        if (p == nodePrimary) {
            return i;
        } else if (p < nodePrimary) {
            if (i == start) {
                return ~start;  // insert s before i
            }
            limit = i;
        } else {
            if (i == start) {
                return ~(start + 1);  // insert s after i
            }
            start = i;
        }
    }
}